

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMImplementationRegistry.cpp
# Opt level: O2

DOMImplementation * xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(XMLCh *features)

{
  BaseRefVectorOf<xercesc_4_0::DOMImplementationSource> *this;
  int iVar1;
  DOMImplementationImpl *pDVar2;
  DOMImplementationSource *pDVar3;
  undefined4 extraout_var;
  XMLSize_t getAt;
  XMLMutexLock lock;
  XMLMutexLock local_20;
  DOMImplementation *pDVar4;
  
  XMLMutexLock::XMLMutexLock(&local_20,gDOMImplSrcVectorMutex);
  this = gDOMImplSrcVector;
  getAt = gDOMImplSrcVector->fCurCount;
  if (getAt == 0) {
    pDVar2 = DOMImplementationImpl::getDOMImplementationImpl();
    pDVar3 = &pDVar2->super_DOMImplementationSource;
    if (pDVar2 == (DOMImplementationImpl *)0x0) {
      pDVar3 = (DOMImplementationSource *)0x0;
    }
    BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::addElement(this,pDVar3);
    getAt = gDOMImplSrcVector->fCurCount;
  }
  do {
    getAt = getAt - 1;
    pDVar4 = (DOMImplementation *)0x0;
    if (getAt == 0xffffffffffffffff) break;
    pDVar3 = BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::elementAt
                       (gDOMImplSrcVector,getAt);
    iVar1 = (*pDVar3->_vptr_DOMImplementationSource[2])(pDVar3,features);
    pDVar4 = (DOMImplementation *)CONCAT44(extraout_var,iVar1);
  } while (pDVar4 == (DOMImplementation *)0x0);
  XMLMutexLock::~XMLMutexLock(&local_20);
  return pDVar4;
}

Assistant:

DOMImplementation *DOMImplementationRegistry::getDOMImplementation(const XMLCh* features) {

    XMLMutexLock lock(gDOMImplSrcVectorMutex);

    XMLSize_t len = gDOMImplSrcVector->size();

    // Put our defined source there
    if (len == 0) {
        gDOMImplSrcVector->addElement((DOMImplementationSource*)DOMImplementationImpl::getDOMImplementationImpl());

        len = gDOMImplSrcVector->size();
    }

    for (XMLSize_t i = len; i > 0; i--) {
        DOMImplementationSource* source = gDOMImplSrcVector->elementAt(i-1);
        DOMImplementation* impl = source->getDOMImplementation(features);
        if (impl)
            return impl;
    }

    return 0;
}